

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_ncc_rule.cpp
# Opt level: O3

void line_ncc_rule(int n,double a,double b,double *x,double *w)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  void *__s;
  long lVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  
  uVar12 = (ulong)(uint)n;
  if (n == 1) {
    *x = (a + b) * 0.5;
  }
  else if (0 < n) {
    iVar3 = n + -1;
    dVar15 = (double)iVar3;
    uVar8 = 0;
    do {
      x[uVar8] = ((double)iVar3 * a + (double)(int)uVar8 * b) / dVar15;
      uVar8 = uVar8 + 1;
      iVar3 = iVar3 + -1;
    } while (uVar8 != uVar12);
  }
  lVar10 = (long)n;
  uVar8 = lVar10 * 8;
  uVar13 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar13 = uVar8;
  }
  __s = operator_new__(uVar13);
  if (0 < n) {
    lVar2 = lVar10 * 8 + -0x10;
    lVar4 = (ulong)(n - 2) + 1;
    uVar13 = 0;
    do {
      memset(__s,0,uVar12 * 8);
      *(undefined8 *)((long)__s + uVar13 * 8) = 0x3ff0000000000000;
      if (n == 1) {
LAB_0020bfbc:
        dVar14 = *(double *)((long)__s + lVar10 * 8 + -8) / (double)n;
        dVar15 = dVar14;
      }
      else {
        uVar5 = 2;
        lVar6 = 1;
        uVar9 = uVar8;
        pdVar7 = x + -2;
        lVar11 = lVar6;
        do {
          do {
            *(double *)((long)__s + (uVar9 - 8)) =
                 (*(double *)((long)__s + (uVar9 - 0x10)) - *(double *)((long)__s + (uVar9 - 8))) /
                 (*(double *)((long)pdVar7 + uVar9) - *(double *)((long)x + (uVar9 - 8)));
            lVar6 = lVar6 + 1;
            uVar9 = uVar9 - 8;
          } while (lVar6 < lVar10);
          uVar5 = uVar5 + 1;
          lVar6 = lVar11 + 1;
          pdVar7 = pdVar7 + -1;
          uVar9 = uVar8;
          lVar11 = lVar6;
        } while (uVar5 != n + 1);
        if (n == 1) goto LAB_0020bfbc;
        uVar5 = 1;
        pdVar7 = x + lVar10 + -2;
        uVar9 = uVar12;
        do {
          if ((long)uVar5 < lVar10) {
            dVar15 = *(double *)((long)__s + lVar10 * 8 + -8);
            lVar11 = 0;
            do {
              dVar15 = *(double *)((long)__s + lVar11 * 8 + lVar2) - dVar15 * pdVar7[lVar11];
              *(double *)((long)__s + lVar11 * 8 + lVar2) = dVar15;
              lVar11 = lVar11 + -1;
            } while (1 - uVar9 != lVar11);
          }
          uVar5 = uVar5 + 1;
          uVar9 = (ulong)((int)uVar9 - 1);
          pdVar7 = pdVar7 + -1;
        } while (uVar5 != uVar12);
        dVar14 = *(double *)((long)__s + lVar10 * 8 + -8) / (double)n;
        lVar11 = lVar4;
        dVar15 = dVar14;
        if (n != 1) {
          do {
            dVar15 = dVar15 * a + *(double *)((long)__s + lVar11 * 8 + -8) / (double)(int)lVar11;
            lVar6 = lVar11 + -1;
            bVar1 = 0 < lVar11;
            lVar11 = lVar6;
          } while (lVar6 != 0 && bVar1);
          lVar11 = lVar4;
          if (n != 1) {
            do {
              dVar14 = dVar14 * b + *(double *)((long)__s + lVar11 * 8 + -8) / (double)(int)lVar11;
              lVar6 = lVar11 + -1;
              bVar1 = 0 < lVar11;
              lVar11 = lVar6;
            } while (lVar6 != 0 && bVar1);
          }
        }
      }
      w[uVar13] = dVar14 * b - dVar15 * a;
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar12);
  }
  operator_delete__(__s);
  return;
}

Assistant:

void line_ncc_rule ( int n, double a, double b, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    LINE_NCC_RULE computes a Newton-Cotes Closed (NCC) quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( A <= X <= B ) F(X) dx
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= N ) W(I) * F ( X(I) ).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Input, double A, B, the endpoints of the interval.
//
//    Input, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double *d;
  int i;
  int j;
  int k;
  double y_a;
  double y_b;
//
//  Define the points X.
//
  r8vec_linspace ( n, a, b, x );

  d = new double[n];

  for ( i = 0; i < n; i++ )
  {
//
//  Compute the Lagrange basis polynomial which is 1 at XTAB(I),
//  and zero at the other nodes.
//
    for ( j = 0; j < n; j++ )
    {
      d[j] = 0.0;
    }
    d[i] = 1.0;

    for ( j = 2; j <= n; j++ )
    {
      for ( k = j; k <= n; k++ )
      {
        d[n+j-k-1] = ( d[n+j-k-2] - d[n+j-k-1] ) / ( x[n-k] - x[n+j-k-1] );
      }
    }
    for ( j = 1; j <= n - 1; j++ )
    {
      for ( k = 1; k <= n - j; k++ )
      {
        d[n-k-1] = d[n-k-1] - x[n-k-j] * d[n-k];
      }
    }
//
//  Evaluate the antiderivative of the polynomial at the endpoints.
//
    y_a = d[n-1] / double( n );
    for ( j = n - 2; 0 <= j; j-- )
    {
      y_a = y_a * a + d[j] / double( j + 1 );
    }
    y_a = y_a * a;

    y_b = d[n-1] / double( n );
    for ( j = n - 2; 0 <= j; j-- )
    {
      y_b = y_b * b + d[j] / double( j + 1 );
    }
    y_b = y_b * b;

    w[i] = y_b - y_a;
  }

  delete [] d;

  return;
}